

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *pFVar4;
  value_type vVar5;
  double dVar6;
  value_type vVar7;
  double dVar8;
  
  vVar5 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
          ::dx(&this->left_->fadexpr_,i);
  dVar6 = sinh(((this->right_->fadexpr_).expr_.fadexpr_.left_)->val_ *
               ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  vVar7 = FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::dx
                    (this->right_,i);
  pFVar3 = (this->left_->fadexpr_).left_;
  pFVar4 = (this->left_->fadexpr_).right_;
  dVar1 = ((pFVar3->fadexpr_).left_)->val_;
  dVar2 = ((pFVar3->fadexpr_).right_)->val_;
  dVar8 = sin(((pFVar4->fadexpr_).expr_.fadexpr_.left_)->val_ *
              ((pFVar4->fadexpr_).expr_.fadexpr_.right_)->val_);
  return dVar8 * dVar1 * dVar2 * vVar7 + dVar6 * vVar5;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}